

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O0

void __thiscall helics::Publication::publishString(Publication *this,string_view val)

{
  string_view val_00;
  bool bVar1;
  data_view *in_RDI;
  SmallBuffer db;
  DataType in_stack_000000fc;
  string_view in_stack_00000100;
  bool doPublish;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  SmallBuffer *this_00;
  double in_stack_fffffffffffffef0;
  SmallBuffer *in_stack_fffffffffffffef8;
  Publication *in_stack_ffffffffffffff08;
  ValueFederate *in_stack_ffffffffffffff10;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  SmallBuffer local_c8;
  byte local_19;
  
  local_19 = in_RDI[1].ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (((ulong)in_RDI[2].ref.
              super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi & 0x100000000) != 0) {
    val_00._M_str = (char *)in_stack_ffffffffffffff08;
    val_00._M_len = (size_t)in_RDI;
    bVar1 = changeDetected((defV *)in_stack_fffffffffffffef8,val_00,in_stack_fffffffffffffef0);
    if (bVar1) {
      in_stack_fffffffffffffef8 = (SmallBuffer *)&stack0xffffffffffffffaf;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (allocator<char> *)in_stack_ffffffffffffff10);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   *)in_RDI,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  in_stack_fffffffffffffef8);
      std::__cxx11::string::~string(in_stack_fffffffffffffee0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
    }
    else {
      local_19 = 0;
    }
  }
  if ((local_19 & 1) != 0) {
    this_00 = &local_c8;
    typeConvert(in_stack_000000fc,in_stack_00000100);
    data_view::data_view(in_RDI,in_stack_fffffffffffffef8);
    helics::ValueFederate::publishBytes(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_RDI);
    data_view::~data_view((data_view *)0x2be865);
    SmallBuffer::~SmallBuffer(this_00);
  }
  return;
}

Assistant:

void Publication::publishString(std::string_view val)
{
    bool doPublish = (fed != nullptr);
    if (changeDetectionEnabled) {
        if (changeDetected(prevValue, val, delta)) {
            prevValue = std::string(val);
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        auto db = typeConvert(pubType, val);
        fed->publishBytes(*this, db);
    }
}